

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_cipher_ssh_aes192_sdctr_sw(void)

{
  test_cipher(&ssh_aes192_sdctr_sw);
  return;
}

Assistant:

static void test_mac(const ssh2_macalg *malg)
{
    ssh2_mac *m = ssh2_mac_new(malg, NULL);
    if (!m) {
        test_skipped = true;
        return;
    }

    uint8_t *mkey = snewn(malg->keylen, uint8_t);
    size_t datalen = 256;
    size_t maclen = malg->len;
    uint8_t *data = snewn(datalen + maclen, uint8_t);

    for (size_t i = 0; i < looplimit(16); i++) {
        random_read(mkey, malg->keylen);
        random_read(data, datalen);
        uint8_t seqbuf[4];
        random_read(seqbuf, 4);
        uint32_t seq = GET_32BIT_MSB_FIRST(seqbuf);

        log_start();
        ssh2_mac_setkey(m, make_ptrlen(mkey, malg->keylen));
        ssh2_mac_generate(m, data, datalen, seq);
        ssh2_mac_verify(m, data, datalen, seq);
        log_end();
    }

    sfree(mkey);
    sfree(data);
    ssh2_mac_free(m);
}